

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc.c
# Opt level: O0

void calccrc(Byte byte)

{
  long lVar1;
  Byte byte_local;
  
  lVar1 = crcsize;
  crcsize = crcsize + -1;
  if (0 < lVar1) {
    crc = crc >> 8 & 0xff ^ crctable[(crc ^ byte) & 0xff];
  }
  return;
}

Assistant:

void
calccrc(Byte byte)
{
	if (crcsize-- > 0)
		/* BB added cast to next line to stop Borland compiler
		   from complaining */
		/* crc = ((crc >> 8) & 0xff) ^ crctable[(crc ^ byte) & 0xff]; */
#ifdef __MSDOS__
		crc = ((crc >> 8) & 0xff) ^ crctable[(int) ((crc ^ byte) & 0xff)];
#else
		crc = ((crc >> 8) & 0xff) ^ crctable[(crc ^ byte) & 0xff];
#endif							/* __MSDOS__ */
}